

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_YMW_Bank(VGMPlayer *this)

{
  UINT8 *pUVar1;
  CHIP_DEVICE *pCVar2;
  DEVFUNC_WRITE_A8D8 UNRECOVERED_JUMPTABLE;
  ulong uVar3;
  byte bVar4;
  UINT8 UVar5;
  DEV_DATA *pDVar6;
  byte bVar7;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar2 == (CHIP_DEVICE *)0x0) ||
     (UNRECOVERED_JUMPTABLE = pCVar2->write8, UNRECOVERED_JUMPTABLE == (DEVFUNC_WRITE_A8D8)0x0)) {
    return;
  }
  pUVar1 = this->_fileData;
  uVar3 = (ulong)this->_filePos;
  bVar7 = pUVar1[uVar3 + 1];
  bVar4 = bVar7 & 3;
  if ((bVar4 == 3) && ((pUVar1[uVar3 + 2] & 8) == 0)) {
    pDVar6 = (pCVar2->base).defInf.dataPtr;
    bVar7 = pUVar1[uVar3 + 2] >> 4;
    UVar5 = '\x10';
  }
  else {
    if (1 < bVar4) {
      (*UNRECOVERED_JUMPTABLE)((pCVar2->base).defInf.dataPtr,'\x11',pUVar1[uVar3 + 2] >> 3);
    }
    if ((bVar7 & 1) == 0) {
      return;
    }
    pDVar6 = (pCVar2->base).defInf.dataPtr;
    UNRECOVERED_JUMPTABLE = pCVar2->write8;
    bVar7 = this->_fileData[(ulong)this->_filePos + 2] >> 3;
    UVar5 = '\x12';
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar6,UVar5,bVar7);
  return;
}

Assistant:

void VGMPlayer::Cmd_YMW_Bank(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	UINT8 bankmask = fData[0x01] & 0x03;
	// fData[0x03] is ignored as we don't support YMW258 ROMs > 16 MB
	if (bankmask == 0x03 && ! (fData[0x02] & 0x08))
	{
		// 1 MB banking (reg 0x10)
		cDev->write8(cDev->base.defInf.dataPtr, 0x10, fData[0x02] / 0x10);
	}
	else
	{
		// 512 KB banking (regs 0x11/0x12)
		if (bankmask & 0x02)	// low bank
			cDev->write8(cDev->base.defInf.dataPtr, 0x11, fData[0x02] / 0x08);
		if (bankmask & 0x01)	// high bank
			cDev->write8(cDev->base.defInf.dataPtr, 0x12, fData[0x02] / 0x08);
	}
	
	return;
}